

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawtransaction.cpp
# Opt level: O1

PartiallySignedTransaction *
ProcessPSBT(PartiallySignedTransaction *__return_storage_ptr__,string *psbt_string,any *context,
           HidingSigningProvider *provider,int sighash_type,bool finalize)

{
  _Rb_tree_header *p_Var1;
  pointer pPVar2;
  long lVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  undefined8 uVar4;
  bool bVar5;
  NodeContext *node;
  ulong uVar6;
  pointer pCVar7;
  mapped_type *pmVar8;
  UniValue *__return_storage_ptr___00;
  PrecomputedTransactionData *txdata;
  ulong uVar9;
  PrecomputedTransactionData *pPVar10;
  ulong uVar11;
  uint uVar12;
  PrecomputedTransactionData *pPVar13;
  CScript *other;
  long in_FS_OFFSET;
  uint256 block_hash;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  coins;
  string error;
  undefined1 local_1c8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  undefined1 local_1b8 [264];
  vector<CTxOut,_std::allocator<CTxOut>_> local_b0;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_88;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->tx).super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
  super__Optional_payload<CMutableTransaction,_true,_false,_false>.
  super__Optional_payload_base<CMutableTransaction>._M_engaged = false;
  p_Var1 = &(__return_storage_ptr__->m_xpubs)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(__return_storage_ptr__->unknown)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->m_xpubs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->outputs).super__Vector_base<PSBTOutput,_std::allocator<PSBTOutput>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->unknown)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->unknown)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__return_storage_ptr__->m_version).super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  p_Var1 = &(__return_storage_ptr__->m_proprietary)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (__return_storage_ptr__->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->m_proprietary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  txdata = (PrecomputedTransactionData *)(local_58 + 0x10);
  local_58._8_8_ = (_Base_ptr)0x0;
  local_58[0x10] = '\0';
  local_58._0_8_ = txdata;
  bVar5 = DecodeBase64PSBT(__return_storage_ptr__,psbt_string,(string *)local_58);
  if (bVar5) {
    if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
        g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
        super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
        super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
      BaseIndex::BlockUntilSyncedToCurrentChain
                ((BaseIndex *)
                 g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                 super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                 super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl);
    }
    node = EnsureAnyNodeContext(context);
    local_88._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_88._M_impl.super__Rb_tree_header._M_header;
    local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    txdata = (PrecomputedTransactionData *)0x0;
    local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
    pCVar7 = *(pointer *)
              &(__return_storage_ptr__->tx).super__Optional_base<CMutableTransaction,_false,_false>.
               _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
               super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
    local_88._M_impl.super__Rb_tree_header._M_header._M_right =
         local_88._M_impl.super__Rb_tree_header._M_header._M_left;
    if (*(pointer *)
         ((long)&(__return_storage_ptr__->tx).
                 super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) !=
        pCVar7) {
      uVar6 = 0;
      uVar11 = 1;
      do {
        pPVar2 = (__return_storage_ptr__->inputs).
                 super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = ((long)(__return_storage_ptr__->inputs).
                       super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                       super__Vector_impl_data._M_finish - (long)pPVar2 >> 5) * -0x70a3d70a3d70a3d7;
        if (uVar9 < uVar6 || uVar9 - uVar6 == 0) {
          if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00a77b57;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
          goto LAB_00a77977;
        }
        if (pPVar2[uVar6].non_witness_utxo.
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          local_1c8 = (undefined1  [8])0x0;
          _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if ((__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)
              g_txindex._M_t.super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
              super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
              super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl !=
              (__uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>)0x0) {
            local_1b8._16_8_ = 0;
            local_1b8._24_8_ = 0;
            local_1b8._0_8_ = (pointer)0x0;
            local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            txdata = (PrecomputedTransactionData *)local_1c8;
            TxIndex::FindTx((TxIndex *)
                            g_txindex._M_t.
                            super___uniq_ptr_impl<TxIndex,_std::default_delete<TxIndex>_>._M_t.
                            super__Tuple_impl<0UL,_TxIndex_*,_std::default_delete<TxIndex>_>.
                            super__Head_base<0UL,_TxIndex_*,_false>._M_head_impl,
                            (uint256 *)(pCVar7 + uVar6),(uint256 *)local_1b8,
                            (CTransactionRef *)txdata);
          }
          if (local_1c8 == (undefined1  [8])0x0) {
            CTxMemPool::get((CTxMemPool *)local_1b8,
                            (uint256 *)
                            (node->mempool)._M_t.
                            super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t
                            .super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                            super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl);
            uVar4 = local_1b8._8_8_;
            local_1c8 = (undefined1  [8])local_1b8._0_8_;
            this._M_pi = _Stack_1c0._M_pi;
            local_1b8._0_8_ = (pointer)0x0;
            local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4;
            if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
            }
          }
          if (local_1c8 == (undefined1  [8])0x0) {
            std::
            map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
            ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                          *)&local_88,&pCVar7[uVar6].prevout);
          }
          else {
            pPVar2[uVar6].non_witness_utxo.
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1c8;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      (&pPVar2[uVar6].non_witness_utxo.
                        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount,&_Stack_1c0);
          }
          if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
          }
        }
        pCVar7 = *(pointer *)
                  &(__return_storage_ptr__->tx).
                   super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                   super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                   super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
        uVar6 = ((long)*(pointer *)
                        ((long)&(__return_storage_ptr__->tx).
                                super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                                super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                super__Optional_payload_base<CMutableTransaction>._M_payload.
                                _M_value.vin + 8) - (long)pCVar7 >> 3) * 0x4ec4ec4ec4ec4ec5;
        bVar5 = uVar11 <= uVar6;
        lVar3 = uVar6 - uVar11;
        uVar6 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar5 && lVar3 != 0);
    }
    if (local_88._M_impl.super__Rb_tree_header._M_node_count != 0) {
      ::node::FindCoins(node,(map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                              *)&local_88);
      pCVar7 = *(pointer *)
                &(__return_storage_ptr__->tx).
                 super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
      if (*(pointer *)
           ((long)&(__return_storage_ptr__->tx).
                   super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                   super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                   super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) !=
          pCVar7) {
        uVar12 = 1;
        pPVar13 = (PrecomputedTransactionData *)0x0;
        do {
          pPVar2 = (__return_storage_ptr__->inputs).
                   super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pPVar10 = (PrecomputedTransactionData *)
                    (((long)(__return_storage_ptr__->inputs).
                            super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pPVar2 >> 5) *
                    -0x70a3d70a3d70a3d7);
          if (pPVar10 < pPVar13 || (long)pPVar10 - (long)pPVar13 == 0) goto LAB_00a779a1;
          if ((pPVar2[(long)pPVar13].non_witness_utxo.
               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
               (element_type *)0x0) &&
             (pmVar8 = std::
                       map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                       ::at((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                             *)&local_88,&pCVar7[(long)pPVar13].prevout), (pmVar8->out).nValue != -1
             )) {
            other = &(pmVar8->out).scriptPubKey;
            bVar5 = IsSegWitOutput(&provider->super_SigningProvider,other);
            if (bVar5) {
              pPVar2[(long)pPVar13].witness_utxo.nValue = (pmVar8->out).nValue;
              prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                        (&pPVar2[(long)pPVar13].witness_utxo.scriptPubKey.super_CScriptBase,
                         &other->super_CScriptBase);
            }
          }
          pPVar13 = (PrecomputedTransactionData *)(ulong)uVar12;
          pCVar7 = *(pointer *)
                    &(__return_storage_ptr__->tx).
                     super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                     super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                     super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin;
          txdata = (PrecomputedTransactionData *)
                   (((long)*(pointer *)
                            ((long)&(__return_storage_ptr__->tx).
                                    super__Optional_base<CMutableTransaction,_false,_false>.
                                    _M_payload.
                                    super__Optional_payload<CMutableTransaction,_true,_false,_false>
                                    .super__Optional_payload_base<CMutableTransaction>._M_payload.
                                    _M_value.vin + 8) - (long)pCVar7 >> 3) * 0x4ec4ec4ec4ec4ec5);
          uVar12 = uVar12 + 1;
        } while (pPVar13 <= txdata && (long)txdata - (long)pPVar13 != 0);
      }
    }
    PrecomputePSBTData((PrecomputedTransactionData *)local_1b8,__return_storage_ptr__);
    if (*(pointer *)
         ((long)&(__return_storage_ptr__->tx).
                 super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin + 8) !=
        *(pointer *)
         &(__return_storage_ptr__->tx).super__Optional_base<CMutableTransaction,_false,_false>.
          _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
          super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vin) {
      uVar12 = 1;
      uVar6 = 0;
      do {
        pPVar2 = (__return_storage_ptr__->inputs).
                 super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = ((long)(__return_storage_ptr__->inputs).
                        super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pPVar2 >> 5) * -0x70a3d70a3d70a3d7
        ;
        if (uVar11 < uVar6 || uVar11 - uVar6 == 0) goto LAB_00a77977;
        bVar5 = PSBTInputSigned(pPVar2 + uVar6);
        if (!bVar5) {
          txdata = (PrecomputedTransactionData *)local_1b8;
          SignPSBTInput(&provider->super_SigningProvider,__return_storage_ptr__,uVar12 - 1,txdata,
                        sighash_type,(SignatureData *)0x0,finalize);
        }
        uVar6 = (ulong)uVar12;
        uVar11 = ((long)*(pointer *)
                         ((long)&(__return_storage_ptr__->tx).
                                 super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                 super__Optional_payload_base<CMutableTransaction>._M_payload.
                                 _M_value.vin + 8) -
                  *(long *)&(__return_storage_ptr__->tx).
                            super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                            vin >> 3) * 0x4ec4ec4ec4ec4ec5;
        uVar12 = uVar12 + 1;
      } while (uVar6 <= uVar11 && uVar11 - uVar6 != 0);
    }
    if (*(pointer *)
         ((long)&(__return_storage_ptr__->tx).
                 super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                 super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout + 8) !=
        *(pointer *)
         &(__return_storage_ptr__->tx).super__Optional_base<CMutableTransaction,_false,_false>.
          _M_payload.super__Optional_payload<CMutableTransaction,_true,_false,_false>.
          super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.vout.
          super__Vector_base<CTxOut,_std::allocator<CTxOut>_>) {
      uVar6 = 0;
      do {
        UpdatePSBTOutput(&provider->super_SigningProvider,__return_storage_ptr__,(int)uVar6);
        uVar6 = (ulong)((int)uVar6 + 1);
        uVar11 = ((long)*(pointer *)
                         ((long)&(__return_storage_ptr__->tx).
                                 super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                                 super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                                 super__Optional_payload_base<CMutableTransaction>._M_payload.
                                 _M_value.vout + 8) -
                  *(long *)&(__return_storage_ptr__->tx).
                            super__Optional_base<CMutableTransaction,_false,_false>._M_payload.
                            super__Optional_payload<CMutableTransaction,_true,_false,_false>.
                            super__Optional_payload_base<CMutableTransaction>._M_payload._M_value.
                            vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_> >> 3) *
                 -0x3333333333333333;
      } while (uVar6 <= uVar11 && uVar11 - uVar6 != 0);
    }
    local_1c8._0_4_ = 1;
    RemoveUnnecessaryTransactions(__return_storage_ptr__,(int *)local_1c8);
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_b0);
    std::
    _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
    ::~_Rb_tree(&local_88);
    if ((PrecomputedTransactionData *)local_58._0_8_ !=
        (PrecomputedTransactionData *)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,CONCAT71(local_58._17_7_,local_58[0x10]) + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
    goto LAB_00a77b57;
  }
  goto LAB_00a779c6;
LAB_00a77977:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00a77b57;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00a779a1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_00a77b57;
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00a779c6:
  __return_storage_ptr___00 = (UniValue *)__cxa_allocate_exception(0x58);
  tinyformat::format<std::__cxx11::string>
            ((string *)local_1b8,(tinyformat *)"TX decode failed %s",local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)txdata);
  JSONRPCError(__return_storage_ptr___00,-0x16,(string *)local_1b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(__return_storage_ptr___00,&UniValue::typeinfo,UniValue::~UniValue);
  }
LAB_00a77b57:
  __stack_chk_fail();
}

Assistant:

PartiallySignedTransaction ProcessPSBT(const std::string& psbt_string, const std::any& context, const HidingSigningProvider& provider, int sighash_type, bool finalize)
{
    // Unserialize the transactions
    PartiallySignedTransaction psbtx;
    std::string error;
    if (!DecodeBase64PSBT(psbtx, psbt_string, error)) {
        throw JSONRPCError(RPC_DESERIALIZATION_ERROR, strprintf("TX decode failed %s", error));
    }

    if (g_txindex) g_txindex->BlockUntilSyncedToCurrentChain();
    const NodeContext& node = EnsureAnyNodeContext(context);

    // If we can't find the corresponding full transaction for all of our inputs,
    // this will be used to find just the utxos for the segwit inputs for which
    // the full transaction isn't found
    std::map<COutPoint, Coin> coins;

    // Fetch previous transactions:
    // First, look in the txindex and the mempool
    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        PSBTInput& psbt_input = psbtx.inputs.at(i);
        const CTxIn& tx_in = psbtx.tx->vin.at(i);

        // The `non_witness_utxo` is the whole previous transaction
        if (psbt_input.non_witness_utxo) continue;

        CTransactionRef tx;

        // Look in the txindex
        if (g_txindex) {
            uint256 block_hash;
            g_txindex->FindTx(tx_in.prevout.hash, block_hash, tx);
        }
        // If we still don't have it look in the mempool
        if (!tx) {
            tx = node.mempool->get(tx_in.prevout.hash);
        }
        if (tx) {
            psbt_input.non_witness_utxo = tx;
        } else {
            coins[tx_in.prevout]; // Create empty map entry keyed by prevout
        }
    }

    // If we still haven't found all of the inputs, look for the missing ones in the utxo set
    if (!coins.empty()) {
        FindCoins(node, coins);
        for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
            PSBTInput& input = psbtx.inputs.at(i);

            // If there are still missing utxos, add them if they were found in the utxo set
            if (!input.non_witness_utxo) {
                const CTxIn& tx_in = psbtx.tx->vin.at(i);
                const Coin& coin = coins.at(tx_in.prevout);
                if (!coin.out.IsNull() && IsSegWitOutput(provider, coin.out.scriptPubKey)) {
                    input.witness_utxo = coin.out;
                }
            }
        }
    }

    const PrecomputedTransactionData& txdata = PrecomputePSBTData(psbtx);

    for (unsigned int i = 0; i < psbtx.tx->vin.size(); ++i) {
        if (PSBTInputSigned(psbtx.inputs.at(i))) {
            continue;
        }

        // Update script/keypath information using descriptor data.
        // Note that SignPSBTInput does a lot more than just constructing ECDSA signatures.
        // We only actually care about those if our signing provider doesn't hide private
        // information, as is the case with `descriptorprocesspsbt`
        SignPSBTInput(provider, psbtx, /*index=*/i, &txdata, sighash_type, /*out_sigdata=*/nullptr, finalize);
    }

    // Update script/keypath information using descriptor data.
    for (unsigned int i = 0; i < psbtx.tx->vout.size(); ++i) {
        UpdatePSBTOutput(provider, psbtx, i);
    }

    RemoveUnnecessaryTransactions(psbtx, /*sighash_type=*/1);

    return psbtx;
}